

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

void __thiscall
pbrt::MLTSampler::MLTSampler
          (MLTSampler *this,int mutationsPerPixel,int rngSequenceIndex,Float sigma,
          Float largeStepProbability,int streamCount)

{
  memory_resource *pmVar1;
  
  this->mutationsPerPixel = mutationsPerPixel;
  RNG::SetSequence(&this->rng,(long)rngSequenceIndex);
  this->sigma = sigma;
  this->largeStepProbability = largeStepProbability;
  this->streamCount = streamCount;
  pmVar1 = pstd::pmr::new_delete_resource();
  (this->X).alloc.memoryResource = pmVar1;
  (this->X).ptr = (PrimarySample *)0x0;
  (this->X).nAlloc = 0;
  (this->X).nStored = 0;
  this->currentIteration = 0;
  this->largeStep = true;
  this->lastLargeStepIteration = 0;
  return;
}

Assistant:

MLTSampler(int mutationsPerPixel, int rngSequenceIndex, Float sigma,
               Float largeStepProbability, int streamCount)
        : mutationsPerPixel(mutationsPerPixel),
          rng(rngSequenceIndex),
          sigma(sigma),
          largeStepProbability(largeStepProbability),
          streamCount(streamCount) {}